

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O3

HPDF_INT HPDF_MemCmp(HPDF_BYTE *s1,HPDF_BYTE *s2,HPDF_UINT n)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  
  iVar1 = 0;
  if (n != 0) {
    bVar3 = *s1;
    bVar4 = *s2;
    if (bVar3 == bVar4) {
      lVar2 = 1;
      do {
        if (n == (HPDF_UINT)lVar2) {
          return 0;
        }
        bVar3 = s1[lVar2];
        bVar4 = s2[lVar2];
        lVar2 = lVar2 + 1;
      } while (bVar3 == bVar4);
    }
    iVar1 = (uint)bVar3 - (uint)bVar4;
  }
  return iVar1;
}

Assistant:

HPDF_INT
HPDF_MemCmp  (const HPDF_BYTE   *s1,
              const HPDF_BYTE   *s2,
              HPDF_UINT          n)
{
    if (n == 0)
        return 0;

    while (*s1 == *s2) {
        n--;
        if (n == 0)
            return 0;
        s1++;
        s2++;
    }

    return *s1 - *s2;
}